

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

string * Vault::operator+(string *__return_storage_ptr__,
                         Tiny<Vault::HostDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *tiny,char *string)

{
  string sStack_38;
  
  Tiny<Vault::HostDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::toString(&sStack_38,tiny);
  std::operator+(__return_storage_ptr__,&sStack_38,string);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string operator+(const Tiny &tiny, const char *string) {
    return tiny.toString() + string;
  }